

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall front::syntax::SyntaxAnalyze::gm_block_item(SyntaxAnalyze *this)

{
  pointer pWVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar3 = this->matched_index + 1;
  pWVar1 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)(((long)(this->word_list->
                             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                     -0x5555555555555555)) {
    bVar2 = word::Word::match_token(pWVar1 + uVar3,CONSTTK);
    if (bVar2) {
      gm_const_decl(this);
      return;
    }
  }
  uVar3 = this->matched_index + 1;
  pWVar1 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)(((long)(this->word_list->
                             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                     -0x5555555555555555)) {
    bVar2 = word::Word::match_token(pWVar1 + uVar3,INTTK);
    if (bVar2) {
      gm_var_decl(this);
      return;
    }
  }
  gm_stmt(this);
  return;
}

Assistant:

void SyntaxAnalyze::gm_block_item() {
  if (try_word(1, Token::CONSTTK)) {
    gm_const_decl();
  } else if (try_word(1, Token::INTTK)) {
    gm_var_decl();
  } else {
    gm_stmt();
  }
}